

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StreamingConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamingConcatenationExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax **args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *args_4,Token *args_5,
          Token *args_6)

{
  Token openBrace;
  Token operatorToken;
  Token innerOpenBrace;
  Token innerCloseBrace;
  Token closeBrace;
  StreamingConcatenationExpressionSyntax *this_00;
  
  this_00 = (StreamingConcatenationExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StreamingConcatenationExpressionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (StreamingConcatenationExpressionSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  operatorToken.kind = args_1->kind;
  operatorToken._2_1_ = args_1->field_0x2;
  operatorToken.numFlags.raw = (args_1->numFlags).raw;
  operatorToken.rawLen = args_1->rawLen;
  operatorToken.info = args_1->info;
  closeBrace.kind = args_6->kind;
  closeBrace._2_1_ = args_6->field_0x2;
  closeBrace.numFlags.raw = (args_6->numFlags).raw;
  closeBrace.rawLen = args_6->rawLen;
  closeBrace.info = args_6->info;
  innerCloseBrace.kind = args_5->kind;
  innerCloseBrace._2_1_ = args_5->field_0x2;
  innerCloseBrace.numFlags.raw = (args_5->numFlags).raw;
  innerCloseBrace.rawLen = args_5->rawLen;
  innerCloseBrace.info = args_5->info;
  innerOpenBrace.kind = args_3->kind;
  innerOpenBrace._2_1_ = args_3->field_0x2;
  innerOpenBrace.numFlags.raw = (args_3->numFlags).raw;
  innerOpenBrace.rawLen = args_3->rawLen;
  innerOpenBrace.info = args_3->info;
  slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
            (this_00,openBrace,operatorToken,*args_2,innerOpenBrace,args_4,innerCloseBrace,
             closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }